

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# y4minput.c
# Opt level: O0

void y4m_42xmpeg2_42xjpeg_helper(uchar *_dst,uchar *_src,int _c_w,int _c_h)

{
  int in_ECX;
  int in_EDX;
  byte *in_RSI;
  long in_RDI;
  int x;
  int y;
  undefined1 local_1dc;
  int local_1d8;
  int local_1c8;
  undefined1 local_1b4;
  int local_1b0;
  int local_1a0;
  int local_190;
  int local_180;
  int local_16c;
  int local_168;
  int local_158;
  undefined1 local_148;
  undefined1 local_144;
  int local_140;
  undefined1 local_13c;
  int local_138;
  int local_128;
  int local_118;
  int local_108;
  undefined1 local_f4;
  int local_f0;
  int local_e0;
  int local_d0;
  int local_c0;
  int local_b0;
  int local_a0;
  int local_90;
  int local_80;
  int local_6c;
  int local_68;
  int local_58;
  int local_48;
  int local_38;
  int local_28;
  int local_20;
  int local_1c;
  byte *local_10;
  long local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_1c = 0; local_1c < in_ECX; local_1c = local_1c + 1) {
    local_20 = 0;
    while( true ) {
      local_28 = in_EDX;
      if (2 < in_EDX) {
        local_28 = 2;
      }
      if (local_28 <= local_20) break;
      if (local_20 + -1 < 0) {
        local_38 = 0;
      }
      else {
        local_38 = local_20 + -1;
      }
      if (in_EDX + -1 < local_20 + 1) {
        local_48 = in_EDX + -1;
      }
      else {
        local_48 = local_20 + 1;
      }
      if (in_EDX + -1 < local_20 + 2) {
        local_58 = in_EDX + -1;
      }
      else {
        local_58 = local_20 + 2;
      }
      if (in_EDX + -1 < local_20 + 3) {
        local_68 = in_EDX + -1;
      }
      else {
        local_68 = local_20 + 3;
      }
      if ((int)((uint)*local_10 * 4 + (uint)local_10[local_38] * -0x11 +
                (uint)local_10[local_20] * 0x72 + (uint)local_10[local_48] * 0x23 +
                (uint)local_10[local_58] * -9 + (uint)local_10[local_68] + 0x40) >> 7 < 0x100) {
        if (local_20 + -1 < 0) {
          local_80 = 0;
        }
        else {
          local_80 = local_20 + -1;
        }
        if (in_EDX + -1 < local_20 + 1) {
          local_90 = in_EDX + -1;
        }
        else {
          local_90 = local_20 + 1;
        }
        if (in_EDX + -1 < local_20 + 2) {
          local_a0 = in_EDX + -1;
        }
        else {
          local_a0 = local_20 + 2;
        }
        if (in_EDX + -1 < local_20 + 3) {
          local_b0 = in_EDX + -1;
        }
        else {
          local_b0 = local_20 + 3;
        }
        local_6c = (int)((uint)*local_10 * 4 + (uint)local_10[local_80] * -0x11 +
                         (uint)local_10[local_20] * 0x72 + (uint)local_10[local_90] * 0x23 +
                         (uint)local_10[local_a0] * -9 + (uint)local_10[local_b0] + 0x40) >> 7;
      }
      else {
        local_6c = 0xff;
      }
      if (local_6c < 1) {
        local_13c = 0;
      }
      else {
        if (local_20 + -1 < 0) {
          local_c0 = 0;
        }
        else {
          local_c0 = local_20 + -1;
        }
        if (in_EDX + -1 < local_20 + 1) {
          local_d0 = in_EDX + -1;
        }
        else {
          local_d0 = local_20 + 1;
        }
        if (in_EDX + -1 < local_20 + 2) {
          local_e0 = in_EDX + -1;
        }
        else {
          local_e0 = local_20 + 2;
        }
        if (in_EDX + -1 < local_20 + 3) {
          local_f0 = in_EDX + -1;
        }
        else {
          local_f0 = local_20 + 3;
        }
        if ((int)((uint)*local_10 * 4 + (uint)local_10[local_c0] * -0x11 +
                  (uint)local_10[local_20] * 0x72 + (uint)local_10[local_d0] * 0x23 +
                  (uint)local_10[local_e0] * -9 + (uint)local_10[local_f0] + 0x40) >> 7 < 0x100) {
          if (local_20 + -1 < 0) {
            local_108 = 0;
          }
          else {
            local_108 = local_20 + -1;
          }
          if (in_EDX + -1 < local_20 + 1) {
            local_118 = in_EDX + -1;
          }
          else {
            local_118 = local_20 + 1;
          }
          if (in_EDX + -1 < local_20 + 2) {
            local_128 = in_EDX + -1;
          }
          else {
            local_128 = local_20 + 2;
          }
          if (in_EDX + -1 < local_20 + 3) {
            local_138 = in_EDX + -1;
          }
          else {
            local_138 = local_20 + 3;
          }
          local_f4 = (undefined1)
                     ((int)((uint)*local_10 * 4 + (uint)local_10[local_108] * -0x11 +
                            (uint)local_10[local_20] * 0x72 + (uint)local_10[local_118] * 0x23 +
                            (uint)local_10[local_128] * -9 + (uint)local_10[local_138] + 0x40) >> 7)
          ;
        }
        else {
          local_f4 = 0xff;
        }
        local_13c = local_f4;
      }
      *(undefined1 *)(local_8 + local_20) = local_13c;
      local_20 = local_20 + 1;
    }
    for (; local_20 < in_EDX + -3; local_20 = local_20 + 1) {
      if ((int)((uint)local_10[local_20 + -2] * 4 + (uint)local_10[local_20 + -1] * -0x11 +
                (uint)local_10[local_20] * 0x72 + (uint)local_10[local_20 + 1] * 0x23 +
                (uint)local_10[local_20 + 2] * -9 + (uint)local_10[local_20 + 3] + 0x40) >> 7 <
          0x100) {
        local_140 = (int)((uint)local_10[local_20 + -2] * 4 + (uint)local_10[local_20 + -1] * -0x11
                          + (uint)local_10[local_20] * 0x72 + (uint)local_10[local_20 + 1] * 0x23 +
                          (uint)local_10[local_20 + 2] * -9 + (uint)local_10[local_20 + 3] + 0x40)
                    >> 7;
      }
      else {
        local_140 = 0xff;
      }
      if (local_140 < 1) {
        local_148 = 0;
      }
      else {
        if ((int)((uint)local_10[local_20 + -2] * 4 + (uint)local_10[local_20 + -1] * -0x11 +
                  (uint)local_10[local_20] * 0x72 + (uint)local_10[local_20 + 1] * 0x23 +
                  (uint)local_10[local_20 + 2] * -9 + (uint)local_10[local_20 + 3] + 0x40) >> 7 <
            0x100) {
          local_144 = (undefined1)
                      ((int)((uint)local_10[local_20 + -2] * 4 +
                             (uint)local_10[local_20 + -1] * -0x11 + (uint)local_10[local_20] * 0x72
                             + (uint)local_10[local_20 + 1] * 0x23 +
                             (uint)local_10[local_20 + 2] * -9 + (uint)local_10[local_20 + 3] + 0x40
                            ) >> 7);
        }
        else {
          local_144 = 0xff;
        }
        local_148 = local_144;
      }
      *(undefined1 *)(local_8 + local_20) = local_148;
    }
    for (; local_20 < in_EDX; local_20 = local_20 + 1) {
      if (in_EDX + -1 < local_20 + 1) {
        local_158 = in_EDX + -1;
      }
      else {
        local_158 = local_20 + 1;
      }
      if (in_EDX + -1 < local_20 + 2) {
        local_168 = in_EDX + -1;
      }
      else {
        local_168 = local_20 + 2;
      }
      if ((int)((uint)local_10[local_20 + -2] * 4 + (uint)local_10[local_20 + -1] * -0x11 +
                (uint)local_10[local_20] * 0x72 + (uint)local_10[local_158] * 0x23 +
                (uint)local_10[local_168] * -9 + (uint)local_10[in_EDX + -1] + 0x40) >> 7 < 0x100) {
        if (in_EDX + -1 < local_20 + 1) {
          local_180 = in_EDX + -1;
        }
        else {
          local_180 = local_20 + 1;
        }
        if (in_EDX + -1 < local_20 + 2) {
          local_190 = in_EDX + -1;
        }
        else {
          local_190 = local_20 + 2;
        }
        local_16c = (int)((uint)local_10[local_20 + -2] * 4 + (uint)local_10[local_20 + -1] * -0x11
                          + (uint)local_10[local_20] * 0x72 + (uint)local_10[local_180] * 0x23 +
                          (uint)local_10[local_190] * -9 + (uint)local_10[in_EDX + -1] + 0x40) >> 7;
      }
      else {
        local_16c = 0xff;
      }
      if (local_16c < 1) {
        local_1dc = 0;
      }
      else {
        if (in_EDX + -1 < local_20 + 1) {
          local_1a0 = in_EDX + -1;
        }
        else {
          local_1a0 = local_20 + 1;
        }
        if (in_EDX + -1 < local_20 + 2) {
          local_1b0 = in_EDX + -1;
        }
        else {
          local_1b0 = local_20 + 2;
        }
        if ((int)((uint)local_10[local_20 + -2] * 4 + (uint)local_10[local_20 + -1] * -0x11 +
                  (uint)local_10[local_20] * 0x72 + (uint)local_10[local_1a0] * 0x23 +
                  (uint)local_10[local_1b0] * -9 + (uint)local_10[in_EDX + -1] + 0x40) >> 7 < 0x100)
        {
          if (in_EDX + -1 < local_20 + 1) {
            local_1c8 = in_EDX + -1;
          }
          else {
            local_1c8 = local_20 + 1;
          }
          if (in_EDX + -1 < local_20 + 2) {
            local_1d8 = in_EDX + -1;
          }
          else {
            local_1d8 = local_20 + 2;
          }
          local_1b4 = (undefined1)
                      ((int)((uint)local_10[local_20 + -2] * 4 +
                             (uint)local_10[local_20 + -1] * -0x11 + (uint)local_10[local_20] * 0x72
                             + (uint)local_10[local_1c8] * 0x23 + (uint)local_10[local_1d8] * -9 +
                             (uint)local_10[in_EDX + -1] + 0x40) >> 7);
        }
        else {
          local_1b4 = 0xff;
        }
        local_1dc = local_1b4;
      }
      *(undefined1 *)(local_8 + local_20) = local_1dc;
    }
    local_8 = local_8 + in_EDX;
    local_10 = local_10 + in_EDX;
  }
  return;
}

Assistant:

static void y4m_42xmpeg2_42xjpeg_helper(unsigned char *_dst,
                                        const unsigned char *_src, int _c_w,
                                        int _c_h) {
  int y;
  int x;
  for (y = 0; y < _c_h; y++) {
    /*Filter: [4 -17 114 35 -9 1]/128, derived from a 6-tap Lanczos
       window.*/
    for (x = 0; x < OC_MINI(_c_w, 2); x++) {
      _dst[x] = (unsigned char)OC_CLAMPI(
          0,
          (4 * _src[0] - 17 * _src[OC_MAXI(x - 1, 0)] + 114 * _src[x] +
           35 * _src[OC_MINI(x + 1, _c_w - 1)] -
           9 * _src[OC_MINI(x + 2, _c_w - 1)] + _src[OC_MINI(x + 3, _c_w - 1)] +
           64) >>
              7,
          255);
    }
    for (; x < _c_w - 3; x++) {
      _dst[x] = (unsigned char)OC_CLAMPI(
          0,
          (4 * _src[x - 2] - 17 * _src[x - 1] + 114 * _src[x] +
           35 * _src[x + 1] - 9 * _src[x + 2] + _src[x + 3] + 64) >>
              7,
          255);
    }
    for (; x < _c_w; x++) {
      _dst[x] = (unsigned char)OC_CLAMPI(
          0,
          (4 * _src[x - 2] - 17 * _src[x - 1] + 114 * _src[x] +
           35 * _src[OC_MINI(x + 1, _c_w - 1)] -
           9 * _src[OC_MINI(x + 2, _c_w - 1)] + _src[_c_w - 1] + 64) >>
              7,
          255);
    }
    _dst += _c_w;
    _src += _c_w;
  }
}